

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::
     call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>
               (QPromise<bool> *promise,QPromiseResolve<bool> *resolve,QPromiseReject<bool> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  anon_class_24_2_d74e9aa7 local_58;
  Data *local_40;
  undefined **local_38;
  PromiseData<bool> *local_30;
  QPromiseBase<bool> local_28;
  
  bVar2 = QtPromise::QPromiseBase<bool>::isFulfilled(&promise->super_QPromiseBase<bool>);
  if (bVar2) {
    PromiseResolver<bool>::resolve<QtPromisePrivate::PromiseValue<bool>const&>
              (&resolve->m_resolver,&((promise->super_QPromiseBase<bool>).m_d.d)->m_value);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<bool>::isRejected(&promise->super_QPromiseBase<bool>);
  if (bVar2) {
    PromiseResolver<bool>::reject<QtPromisePrivate::PromiseError_const&>
              (&reject->m_resolver,
               &(((promise->super_QPromiseBase<bool>).m_d.d)->
                super_PromiseDataBase<bool,_void_(const_bool_&)>).m_error);
    return;
  }
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<bool>)(resolve->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<bool>.m_d.d = (promise->super_QPromiseBase<bool>).m_d.d;
  if (local_58.promise.super_QPromiseBase<bool>.m_d.d != (PromiseData<bool> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<bool>.m_d.d)->
              super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<bool>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00142700;
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<bool>).m_d.d;
  if (local_30 != (PromiseData<bool> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<bool,_void_(const_bool_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_00142700;
  QtPromise::QPromiseBase<bool>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)::_lambda()_2_>
            (&local_28,(anon_class_24_2_e6a34898 *)promise,&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_28);
  call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)
  ::{lambda()#1}::~call((_lambda___1_ *)&local_58);
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }